

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

uint16 __thiscall
Js::FunctionExecutionStateMachine::GetSimpleJitExecutedIterations
          (FunctionExecutionStateMachine *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode executionMode;
  undefined4 *puVar4;
  FunctionEntryPointInfo *pFVar5;
  char *this_00;
  
  this_00 = (char *)this;
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x136,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) goto LAB_0078b51c;
    *puVar4 = 0;
  }
  executionMode = StateToMode((FunctionExecutionStateMachine *)this_00,this->executionState);
  VerifyExecutionMode(this,executionMode);
  if (executionMode != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x137,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar3) goto LAB_0078b51c;
    *puVar4 = 0;
  }
  pFVar5 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
  if (pFVar5 == (FunctionEntryPointInfo *)0x0) {
    return 0;
  }
  uVar1 = pFVar5->callsCount;
  if (this->simpleJitLimit == 0) {
    if (uVar1 == 0) goto LAB_0078b509;
LAB_0078b4a9:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x141,
                                "(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount)"
                                ,"simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount"
                               );
    if (!bVar3) {
LAB_0078b51c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  else if (this->simpleJitLimit <= uVar1) goto LAB_0078b4a9;
  if (uVar1 != 0) {
    return ~(ushort)uVar1 + this->simpleJitLimit;
  }
LAB_0078b509:
  return this->simpleJitLimit;
}

Assistant:

uint16 FunctionExecutionStateMachine::GetSimpleJitExecutedIterations() const
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);

        FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
        if (!simpleJitEntryPointInfo)
        {
            return 0;
        }

        // Simple JIT counts down and transitions on overflow
        const uint32 callCount = simpleJitEntryPointInfo->callsCount;
        Assert(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount);
        return callCount == 0 ?
            static_cast<uint16>(simpleJitLimit) :
            static_cast<uint16>(simpleJitLimit) - static_cast<uint16>(callCount) - 1;
    }